

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O1

uint64_t evaluate_solution(color_quad_u8 *pLow,color_quad_u8 *pHigh,uint32_t *pbits,
                          color_cell_compressor_params *pParams,
                          color_cell_compressor_results *pResults)

{
  bc7enc_bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  color_quad_u8 *pcVar5;
  char cVar6;
  byte bVar10;
  byte bVar14;
  short sVar18;
  short sVar19;
  uint uVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [14];
  undefined1 auVar23 [15];
  undefined1 auVar24 [14];
  undefined1 auVar25 [15];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  unkuint9 Var42;
  undefined1 auVar43 [11];
  undefined1 auVar44 [13];
  undefined1 auVar45 [14];
  undefined1 auVar46 [15];
  undefined1 auVar47 [11];
  undefined1 auVar48 [14];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  uint6 uVar53;
  int iVar54;
  uint64_t uVar55;
  void *pvVar56;
  int iVar57;
  ulong uVar58;
  uint uVar59;
  ulong uVar60;
  uint8_t uVar61;
  uint uVar62;
  int iVar63;
  uint uVar64;
  undefined1 *puVar65;
  ulong uVar66;
  int iVar67;
  int iVar68;
  ulong uVar69;
  uint uVar70;
  ulong uVar71;
  ulong uVar72;
  int iVar73;
  uint32_t j;
  long lVar74;
  ulong uVar75;
  uint uVar76;
  undefined1 uVar78;
  undefined1 uVar79;
  undefined1 uVar80;
  ushort uVar81;
  undefined1 auVar77 [13];
  undefined1 auVar82 [13];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  short sVar86;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined4 local_d0;
  undefined4 local_cc;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  color_cell_compressor_params *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  color_cell_compressor_results *local_98;
  int local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined1 local_84 [12];
  color_quad_u8 actualMaxColor;
  color_quad_u8 actualMinColor;
  char cVar7;
  char cVar8;
  char cVar9;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  undefined4 uVar87;
  undefined6 uVar88;
  
  local_98 = pResults;
  if (pParams->m_has_pbits == '\0') {
    auVar82 = ZEXT413(*(uint *)pLow->m_c);
    auVar77 = ZEXT413(*(uint *)pHigh->m_c);
  }
  else {
    uVar2 = *pbits;
    uVar3 = uVar2;
    if (pParams->m_endpoints_share_pbit == '\0') {
      uVar3 = pbits[1];
    }
    uVar87 = *(undefined4 *)pLow->m_c;
    uVar80 = (undefined1)(uVar2 >> 0x18);
    uVar79 = (undefined1)(uVar2 >> 0x10);
    uVar78 = (undefined1)(uVar2 >> 8);
    auVar83._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar79),CONCAT14(uVar79,uVar2)) >> 0x20);
    auVar83[3] = uVar78;
    auVar83[2] = uVar78;
    auVar83[0] = (undefined1)uVar2;
    auVar83[1] = auVar83[0];
    auVar83._8_8_ = 0;
    auVar84 = pshuflw(auVar83,auVar83,0);
    auVar82 = auVar84._0_13_ |
              ZEXT413(CONCAT13((char)((uint)uVar87 >> 0x18) * '\x02',
                               CONCAT12((char)((uint)uVar87 >> 0x10) * '\x02',
                                        CONCAT11((char)((uint)uVar87 >> 8) * '\x02',
                                                 (char)uVar87 * '\x02'))));
    uVar87 = *(undefined4 *)pHigh->m_c;
    uVar80 = (undefined1)(uVar3 >> 0x18);
    uVar79 = (undefined1)(uVar3 >> 0x10);
    uVar78 = (undefined1)(uVar3 >> 8);
    auVar84._4_4_ =
         (int)(CONCAT35(CONCAT21(CONCAT11(uVar80,uVar80),uVar79),CONCAT14(uVar79,uVar3)) >> 0x20);
    auVar84[3] = uVar78;
    auVar84[2] = uVar78;
    auVar84[0] = (undefined1)uVar3;
    auVar84[1] = auVar84[0];
    auVar84._8_8_ = 0;
    auVar84 = pshuflw(auVar84,auVar84,0);
    auVar77 = auVar84._0_13_ |
              ZEXT413(CONCAT13((char)((uint)uVar87 >> 0x18) * '\x02',
                               CONCAT12((char)((uint)uVar87 >> 0x10) * '\x02',
                                        CONCAT11((char)((uint)uVar87 >> 8) * '\x02',
                                                 (char)uVar87 * '\x02'))));
  }
  uVar59 = (pParams->m_comp_bits + 1) - (uint)(pParams->m_has_pbits == '\0');
  iVar54 = 8 - uVar59;
  auVar23[0xd] = 0;
  auVar23._0_13_ = auVar82;
  auVar23[0xe] = auVar82[7];
  auVar28[0xc] = auVar82[6];
  auVar28._0_12_ = auVar82._0_12_;
  auVar28._13_2_ = auVar23._13_2_;
  auVar30[0xb] = 0;
  auVar30._0_11_ = auVar82._0_11_;
  auVar30._12_3_ = auVar28._12_3_;
  auVar33[10] = auVar82[5];
  auVar33._0_10_ = auVar82._0_10_;
  auVar33._11_4_ = auVar30._11_4_;
  auVar35[9] = 0;
  auVar35._0_9_ = auVar82._0_9_;
  auVar35._10_5_ = auVar33._10_5_;
  auVar37[8] = auVar82[4];
  auVar37._0_8_ = auVar82._0_8_;
  auVar37._9_6_ = auVar35._9_6_;
  auVar41._7_8_ = 0;
  auVar41._0_7_ = auVar37._8_7_;
  Var42 = CONCAT81(SUB158(auVar41 << 0x40,7),auVar82[3]);
  auVar49._9_6_ = 0;
  auVar49._0_9_ = Var42;
  auVar43._1_10_ = SUB1510(auVar49 << 0x30,5);
  auVar43[0] = auVar82[2];
  auVar50._11_4_ = 0;
  auVar50._0_11_ = auVar43;
  auVar44._1_12_ = SUB1512(auVar50 << 0x20,3);
  auVar44[0] = auVar82[1];
  uVar81 = CONCAT11(0,auVar82[0]);
  auVar40._2_13_ = auVar44;
  auVar40._0_2_ = uVar81;
  auVar24._10_2_ = 0;
  auVar24._0_10_ = auVar40._0_10_;
  auVar24._12_2_ = (short)Var42;
  uVar53 = CONCAT42(auVar24._10_4_,auVar43._0_2_);
  auVar45._6_8_ = 0;
  auVar45._0_6_ = uVar53;
  auVar85._0_4_ = (uint)uVar81 << iVar54;
  auVar85._4_4_ = (uint)CONCAT82(SUB148(auVar45 << 0x40,6),auVar44._0_2_);
  auVar85._8_4_ = (uint)uVar53;
  uVar76 = auVar24._10_4_ >> 0x10;
  auVar85._12_4_ = uVar76;
  uVar69 = (ulong)uVar59;
  auVar89._0_4_ = auVar85._0_4_ >> uVar69;
  auVar89._4_4_ = auVar85._4_4_ >> uVar69;
  auVar89._8_4_ = auVar85._8_4_ >> uVar69;
  auVar89._12_4_ = uVar76 >> uVar69;
  auVar84 = (auVar89 | auVar85) & _DAT_00121050;
  sVar18 = auVar84._0_2_;
  cVar6 = (0 < sVar18) * (sVar18 < 0x100) * auVar84[0] - (0xff < sVar18);
  sVar18 = auVar84._2_2_;
  sVar86 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar84[2] - (0xff < sVar18),cVar6);
  sVar18 = auVar84._4_2_;
  cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar84[4] - (0xff < sVar18);
  sVar18 = auVar84._6_2_;
  uVar87 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar84[6] - (0xff < sVar18),
                    CONCAT12(cVar7,sVar86));
  sVar18 = auVar84._8_2_;
  cVar8 = (0 < sVar18) * (sVar18 < 0x100) * auVar84[8] - (0xff < sVar18);
  sVar18 = auVar84._10_2_;
  uVar88 = CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar84[10] - (0xff < sVar18),
                    CONCAT14(cVar8,uVar87));
  sVar18 = auVar84._12_2_;
  cVar9 = (0 < sVar18) * (sVar18 < 0x100) * auVar84[0xc] - (0xff < sVar18);
  sVar19 = auVar84._14_2_;
  auVar21[0xd] = 0;
  auVar21._0_13_ = auVar77;
  auVar21[0xe] = auVar77[7];
  auVar25[0xc] = auVar77[6];
  auVar25._0_12_ = auVar77._0_12_;
  auVar25._13_2_ = auVar21._13_2_;
  auVar29[0xb] = 0;
  auVar29._0_11_ = auVar77._0_11_;
  auVar29._12_3_ = auVar25._12_3_;
  auVar31[10] = auVar77[5];
  auVar31._0_10_ = auVar77._0_10_;
  auVar31._11_4_ = auVar29._11_4_;
  auVar34[9] = 0;
  auVar34._0_9_ = auVar77._0_9_;
  auVar34._10_5_ = auVar31._10_5_;
  auVar36[8] = auVar77[4];
  auVar36._0_8_ = auVar77._0_8_;
  auVar36._9_6_ = auVar34._9_6_;
  auVar46._7_8_ = 0;
  auVar46._0_7_ = auVar36._8_7_;
  Var42 = CONCAT81(SUB158(auVar46 << 0x40,7),auVar77[3]);
  auVar51._9_6_ = 0;
  auVar51._0_9_ = Var42;
  auVar47._1_10_ = SUB1510(auVar51 << 0x30,5);
  auVar47[0] = auVar77[2];
  auVar52._11_4_ = 0;
  auVar52._0_11_ = auVar47;
  auVar38[2] = auVar77[1];
  auVar38._0_2_ = auVar77._0_2_;
  auVar38._3_12_ = SUB1512(auVar52 << 0x20,3);
  auVar39._2_13_ = auVar38._2_13_;
  auVar39._0_2_ = auVar77._0_2_ & 0xff;
  uVar81 = (ushort)Var42;
  auVar22._10_2_ = 0;
  auVar22._0_10_ = auVar39._0_10_;
  auVar22._12_2_ = uVar81;
  uVar53 = CONCAT42(auVar22._10_4_,auVar47._0_2_);
  auVar48._6_8_ = 0;
  auVar48._0_6_ = uVar53;
  auVar32._4_2_ = auVar38._2_2_;
  auVar32._0_4_ = auVar39._0_4_;
  auVar32._6_8_ = SUB148(auVar48 << 0x40,6);
  uVar76 = (auVar39._0_4_ & 0xffff) << iVar54;
  auVar26._4_4_ = auVar32._4_4_;
  auVar26._0_4_ = uVar76;
  uVar59 = (uint)uVar53;
  auVar26._8_4_ = uVar59;
  auVar26._12_2_ = uVar81;
  bVar10 = (0 < sVar86) * (sVar86 < 0x100) * cVar6 - (0xff < sVar86);
  sVar18 = (short)((uint)uVar87 >> 0x10);
  bVar11 = (0 < sVar18) * (sVar18 < 0x100) * cVar7 - (0xff < sVar18);
  sVar18 = (short)((uint6)uVar88 >> 0x20);
  bVar12 = (0 < sVar18) * (sVar18 < 0x100) * cVar8 - (0xff < sVar18);
  sVar18 = (short)(CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar84[0xe] - (0xff < sVar19),
                            CONCAT16(cVar9,uVar88)) >> 0x30);
  bVar13 = (0 < sVar18) * (sVar18 < 0x100) * cVar9 - (0xff < sVar18);
  local_cc = CONCAT13(bVar13,CONCAT12(bVar12,CONCAT11(bVar11,bVar10)));
  auVar27._4_4_ = auVar32._4_4_ >> uVar69;
  auVar27._0_4_ = uVar76 >> uVar69;
  auVar27._8_4_ = uVar59 >> uVar69;
  auVar27._12_2_ = uVar81 >> uVar69;
  auVar90._14_2_ = 0;
  auVar90._0_14_ = auVar27 | auVar26;
  auVar90 = auVar90 & _DAT_00121050;
  sVar18 = auVar90._0_2_;
  cVar6 = (0 < sVar18) * (sVar18 < 0x100) * auVar90[0] - (0xff < sVar18);
  sVar18 = auVar90._2_2_;
  sVar86 = CONCAT11((0 < sVar18) * (sVar18 < 0x100) * auVar90[2] - (0xff < sVar18),cVar6);
  sVar18 = auVar90._4_2_;
  cVar7 = (0 < sVar18) * (sVar18 < 0x100) * auVar90[4] - (0xff < sVar18);
  sVar18 = auVar90._6_2_;
  uVar87 = CONCAT13((0 < sVar18) * (sVar18 < 0x100) * auVar90[6] - (0xff < sVar18),
                    CONCAT12(cVar7,sVar86));
  sVar18 = auVar90._8_2_;
  cVar8 = (0 < sVar18) * (sVar18 < 0x100) * auVar90[8] - (0xff < sVar18);
  sVar18 = auVar90._10_2_;
  uVar88 = CONCAT15((0 < sVar18) * (sVar18 < 0x100) * auVar90[10] - (0xff < sVar18),
                    CONCAT14(cVar8,uVar87));
  sVar18 = auVar90._12_2_;
  cVar9 = (0 < sVar18) * (sVar18 < 0x100) * auVar90[0xc] - (0xff < sVar18);
  sVar19 = auVar90._14_2_;
  bVar14 = (0 < sVar86) * (sVar86 < 0x100) * cVar6 - (0xff < sVar86);
  sVar18 = (short)((uint)uVar87 >> 0x10);
  bVar15 = (0 < sVar18) * (sVar18 < 0x100) * cVar7 - (0xff < sVar18);
  sVar18 = (short)((uint6)uVar88 >> 0x20);
  bVar16 = (0 < sVar18) * (sVar18 < 0x100) * cVar8 - (0xff < sVar18);
  sVar18 = (short)(CONCAT17((0 < sVar19) * (sVar19 < 0x100) * auVar90[0xe] - (0xff < sVar19),
                            CONCAT16(cVar9,uVar88)) >> 0x30);
  bVar17 = (0 < sVar18) * (sVar18 < 0x100) * cVar9 - (0xff < sVar18);
  local_d0 = CONCAT13(bVar17,CONCAT12(bVar16,CONCAT11(bVar15,bVar14)));
  uVar69 = (ulong)pParams->m_num_selector_weights;
  local_88 = local_cc;
  uVar76 = pParams->m_num_selector_weights - 1;
  *(undefined4 *)(local_84 + (ulong)uVar76 * 4 + -4) = local_d0;
  local_b0 = pParams;
  bVar1 = pParams->m_has_alpha;
  uVar55 = (uint64_t)CONCAT31((int3)((uint)iVar54 >> 8),bVar1);
  if (1 < uVar76) {
    puVar4 = pParams->m_pSelector_weights;
    uVar58 = 1;
    puVar65 = local_84;
    do {
      uVar2 = puVar4[uVar58];
      lVar74 = 0;
      do {
        puVar65[lVar74] =
             (char)((uint)*(byte *)((long)&local_cc + lVar74) * (0x40 - uVar2) +
                    *(byte *)((long)&local_d0 + lVar74) * uVar2 + 0x20 >> 6);
        lVar74 = lVar74 + 1;
      } while (4 - (ulong)(bVar1 == '\0') != lVar74);
      uVar58 = uVar58 + 1;
      puVar65 = puVar65 + 4;
    } while (uVar58 != uVar76);
  }
  if (pParams->m_perceptual == '\0') {
    local_9c = (uint)bVar10;
    iVar68 = bVar14 - local_9c;
    local_c8 = CONCAT44(local_c8._4_4_,iVar68);
    local_a0 = (uint)bVar11;
    iVar54 = bVar15 - local_a0;
    local_b8 = CONCAT44(local_b8._4_4_,iVar54);
    local_a4 = (uint)bVar12;
    iVar57 = bVar16 - local_a4;
    local_c0 = CONCAT44(local_c0._4_4_,iVar57);
    if (bVar1 == '\0') {
      if (pParams->m_num_pixels != 0) {
        uVar58 = 0;
        uVar72 = 0;
        do {
          pcVar5 = pParams->m_pPixels;
          bVar10 = pcVar5[uVar58].m_c[0];
          bVar11 = pcVar5[uVar58].m_c[1];
          bVar12 = pcVar5[uVar58].m_c[2];
          uVar64 = (uint)((float)(int)((bVar12 - local_a4) * iVar57 +
                                      (bVar11 - local_a0) * iVar54 + (bVar10 - local_9c) * iVar68) *
                          ((float)uVar69 /
                          ((float)(iVar57 * iVar57 + iVar54 * iVar54 + iVar68 * iVar68) + 1.25e-06))
                         + 0.5);
          uVar59 = uVar64;
          if ((int)uVar76 <= (int)uVar64) {
            uVar59 = uVar76;
          }
          uVar62 = 1;
          if (0 < (int)uVar64) {
            uVar62 = uVar59;
          }
          lVar74 = (long)(int)uVar62;
          iVar63 = (uint)*(byte *)((long)&local_8c + lVar74 * 4 + 1) - (uint)bVar11;
          iVar67 = (uint)*(byte *)((long)&local_8c + lVar74 * 4 + 2) - (uint)bVar12;
          uVar70 = iVar67 * iVar67 * pParams->m_weights[2] +
                   iVar63 * iVar63 * pParams->m_weights[1] +
                   ((uint)*(byte *)(&local_8c + lVar74) - (uint)bVar10) *
                   ((uint)*(byte *)(&local_8c + lVar74) - (uint)bVar10) * pParams->m_weights[0];
          iVar63 = (uint)(byte)local_84[lVar74 * 4 + -4] - (uint)bVar10;
          uVar64 = pParams->m_weights[2] * ((uint)(byte)local_84[lVar74 * 4 + -2] - (uint)bVar12) *
                   ((uint)(byte)local_84[lVar74 * 4 + -2] - (uint)bVar12) +
                   pParams->m_weights[1] * ((uint)(byte)local_84[lVar74 * 4 + -3] - (uint)bVar11) *
                   ((uint)(byte)local_84[lVar74 * 4 + -3] - (uint)bVar11) +
                   pParams->m_weights[0] * iVar63 * iVar63;
          uVar59 = uVar64;
          if (uVar70 < uVar64) {
            uVar59 = uVar70;
          }
          uVar20 = uVar62 - 1 & 0xff;
          if (uVar70 >= uVar64) {
            uVar20 = uVar62;
          }
          uVar72 = uVar72 + uVar59;
          pResults->m_pSelectors_temp[uVar58] = (uint8_t)uVar20;
          uVar58 = uVar58 + 1;
          uVar55 = (uint64_t)pParams->m_num_pixels;
        } while (uVar58 < uVar55);
        goto LAB_0010a6b6;
      }
    }
    else if (pParams->m_num_pixels != 0) {
      local_8c = (uint)bVar13;
      local_90 = bVar17 - local_8c;
      uVar58 = 0;
      uVar72 = 0;
      do {
        pcVar5 = pParams->m_pPixels;
        bVar10 = pcVar5[uVar58].m_c[0];
        bVar11 = pcVar5[uVar58].m_c[1];
        bVar12 = pcVar5[uVar58].m_c[2];
        bVar13 = pcVar5[uVar58].m_c[3];
        uVar64 = (uint)((float)(int)((bVar13 - local_8c) * local_90 + (bVar12 - local_a4) * iVar57 +
                                    (bVar11 - local_a0) * iVar54 + (bVar10 - local_9c) * iVar68) *
                        ((float)uVar69 /
                        ((float)(local_90 * local_90 + iVar57 * iVar57 +
                                iVar54 * iVar54 + iVar68 * iVar68) + 1.25e-06)) + 0.5);
        uVar59 = uVar64;
        if ((int)uVar76 <= (int)uVar64) {
          uVar59 = uVar76;
        }
        uVar62 = 1;
        if (0 < (int)uVar64) {
          uVar62 = uVar59;
        }
        lVar74 = (long)(int)uVar62;
        iVar73 = (uint)*(byte *)((long)&local_8c + lVar74 * 4 + 1) - (uint)bVar11;
        iVar63 = (uint)*(byte *)((long)&local_8c + lVar74 * 4 + 2) - (uint)bVar12;
        iVar67 = (uint)*(byte *)((long)&local_8c + lVar74 * 4 + 3) - (uint)bVar13;
        uVar60 = (ulong)(iVar67 * iVar67 * pParams->m_weights[3]) +
                 (ulong)(iVar63 * iVar63 * pParams->m_weights[2] +
                        iVar73 * iVar73 * pParams->m_weights[1] +
                        ((uint)*(byte *)(&local_8c + lVar74) - (uint)bVar10) *
                        ((uint)*(byte *)(&local_8c + lVar74) - (uint)bVar10) * pParams->m_weights[0]
                        );
        iVar67 = (uint)(byte)local_84[lVar74 * 4 + -4] - (uint)bVar10;
        iVar63 = (uint)(byte)local_84[lVar74 * 4 + -1] - (uint)bVar13;
        uVar71 = (ulong)(pParams->m_weights[3] * iVar63 * iVar63) +
                 (ulong)(pParams->m_weights[2] *
                         ((uint)(byte)local_84[lVar74 * 4 + -2] - (uint)bVar12) *
                         ((uint)(byte)local_84[lVar74 * 4 + -2] - (uint)bVar12) +
                        pParams->m_weights[1] *
                        ((uint)(byte)local_84[lVar74 * 4 + -3] - (uint)bVar11) *
                        ((uint)(byte)local_84[lVar74 * 4 + -3] - (uint)bVar11) +
                        pParams->m_weights[0] * iVar67 * iVar67);
        uVar59 = uVar62 - 1 & 0xff;
        if (uVar71 <= uVar60) {
          uVar59 = uVar62;
        }
        pResults->m_pSelectors_temp[uVar58] = (uint8_t)uVar59;
        if (uVar60 <= uVar71) {
          uVar71 = uVar60;
        }
        uVar72 = uVar72 + uVar71;
        uVar58 = uVar58 + 1;
        uVar55 = (uint64_t)pParams->m_num_pixels;
      } while (uVar58 < uVar55);
      goto LAB_0010a6b6;
    }
  }
  else if (pParams->m_num_pixels != 0) {
    uVar58 = 0;
    uVar72 = 0;
    local_c8 = uVar69;
    do {
      local_b8 = uVar72;
      local_c0 = uVar58;
      if (pParams->m_has_alpha == '\0') {
        if (uVar69 == 0) goto LAB_0010a31c;
        pcVar5 = pParams->m_pPixels;
        iVar54 = (uint)pcVar5[uVar58].m_c[2] * 0x25 +
                 (uint)pcVar5[uVar58].m_c[1] * 0x16e + (uint)pcVar5[uVar58].m_c[0] * 0x6d;
        uVar71 = 0xffffffffffffffff;
        uVar75 = 0;
        uVar60 = 0;
        do {
          iVar57 = (uint)(byte)local_84[uVar75 * 4 + -2] * 0x25 +
                   (uint)(byte)local_84[uVar75 * 4 + -3] * 0x16e +
                   (uint)(byte)local_84[uVar75 * 4 + -4] * 0x6d;
          iVar63 = iVar57 - iVar54 >> 8;
          iVar68 = (int)((((uint)(byte)local_84[uVar75 * 4 + -4] - (uint)pcVar5[uVar58].m_c[0]) *
                          0x200 - iVar57) + iVar54) >> 8;
          iVar57 = (int)(((uint)(byte)local_84[uVar75 * 4 + -2] * 0x200 -
                         (iVar57 + (uint)pcVar5[uVar58].m_c[2] * 0x200)) + iVar54) >> 8;
          uVar66 = (ulong)(iVar57 * pParams->m_weights[2] * iVar57 +
                          iVar68 * pParams->m_weights[1] * iVar68 +
                          iVar63 * pParams->m_weights[0] * iVar63);
          if (uVar66 < uVar71) {
            uVar60 = uVar75 & 0xffffffff;
          }
          uVar61 = (uint8_t)uVar60;
          if (uVar66 <= uVar71) {
            uVar71 = uVar66;
          }
          uVar75 = uVar75 + 1;
        } while (uVar69 != uVar75);
      }
      else if (uVar69 == 0) {
LAB_0010a31c:
        uVar61 = '\0';
        uVar71 = 0xffffffffffffffff;
      }
      else {
        pcVar5 = pParams->m_pPixels;
        iVar54 = (uint)pcVar5[uVar58].m_c[2] * 0x25 +
                 (uint)pcVar5[uVar58].m_c[1] * 0x16e + (uint)pcVar5[uVar58].m_c[0] * 0x6d;
        uVar71 = 0xffffffffffffffff;
        uVar60 = 0;
        uVar75 = 0;
        do {
          iVar68 = (uint)(byte)local_84[uVar60 * 4 + -2] * 0x25 +
                   (uint)(byte)local_84[uVar60 * 4 + -3] * 0x16e +
                   (uint)(byte)local_84[uVar60 * 4 + -4] * 0x6d;
          iVar67 = iVar68 - iVar54 >> 8;
          iVar57 = (int)((((uint)(byte)local_84[uVar60 * 4 + -4] - (uint)pcVar5[uVar58].m_c[0]) *
                          0x200 - iVar68) + iVar54) >> 8;
          iVar68 = (int)(((uint)(byte)local_84[uVar60 * 4 + -2] * 0x200 -
                         (iVar68 + (uint)pcVar5[uVar58].m_c[2] * 0x200)) + iVar54) >> 8;
          iVar63 = (uint)(byte)local_84[uVar60 * 4 + -1] - (uint)pcVar5[uVar58].m_c[3];
          uVar66 = (ulong)(iVar63 * iVar63 * pParams->m_weights[3]) +
                   (ulong)(iVar68 * pParams->m_weights[2] * iVar68 +
                          iVar57 * pParams->m_weights[1] * iVar57 +
                          iVar67 * pParams->m_weights[0] * iVar67);
          if (uVar66 < uVar71) {
            uVar75 = uVar60 & 0xffffffff;
            uVar71 = uVar66;
          }
          uVar61 = (uint8_t)uVar75;
          uVar60 = uVar60 + 1;
        } while (uVar69 != uVar60);
      }
      uVar72 = uVar72 + uVar71;
      pResults->m_pSelectors_temp[uVar58] = uVar61;
      uVar58 = uVar58 + 1;
      uVar55 = (uint64_t)pParams->m_num_pixels;
    } while (uVar58 < uVar55);
    goto LAB_0010a6b6;
  }
  uVar72 = 0;
LAB_0010a6b6:
  if (uVar72 < pResults->m_best_overall_err) {
    pResults->m_best_overall_err = uVar72;
    *(undefined4 *)(pResults->m_low_endpoint).m_c = *(undefined4 *)pLow->m_c;
    *(undefined4 *)(pResults->m_high_endpoint).m_c = *(undefined4 *)pHigh->m_c;
    pResults->m_pbits[0] = *pbits;
    pResults->m_pbits[1] = pbits[1];
    pvVar56 = memcpy(pResults->m_pSelectors,pResults->m_pSelectors_temp,(ulong)pParams->m_num_pixels
                    );
    return (uint64_t)pvVar56;
  }
  return uVar55;
}

Assistant:

static uint64_t evaluate_solution(const color_quad_u8 *pLow, const color_quad_u8 *pHigh, const uint32_t pbits[2], const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults)
{
	color_quad_u8 quantMinColor = *pLow;
	color_quad_u8 quantMaxColor = *pHigh;

	if (pParams->m_has_pbits)
	{
		uint32_t minPBit, maxPBit;

		if (pParams->m_endpoints_share_pbit)
			maxPBit = minPBit = pbits[0];
		else
		{
			minPBit = pbits[0];
			maxPBit = pbits[1];
		}

		quantMinColor.m_c[0] = (uint8_t)((pLow->m_c[0] << 1) | minPBit);
		quantMinColor.m_c[1] = (uint8_t)((pLow->m_c[1] << 1) | minPBit);
		quantMinColor.m_c[2] = (uint8_t)((pLow->m_c[2] << 1) | minPBit);
		quantMinColor.m_c[3] = (uint8_t)((pLow->m_c[3] << 1) | minPBit);

		quantMaxColor.m_c[0] = (uint8_t)((pHigh->m_c[0] << 1) | maxPBit);
		quantMaxColor.m_c[1] = (uint8_t)((pHigh->m_c[1] << 1) | maxPBit);
		quantMaxColor.m_c[2] = (uint8_t)((pHigh->m_c[2] << 1) | maxPBit);
		quantMaxColor.m_c[3] = (uint8_t)((pHigh->m_c[3] << 1) | maxPBit);
	}

	color_quad_u8 actualMinColor = scale_color(&quantMinColor, pParams);
	color_quad_u8 actualMaxColor = scale_color(&quantMaxColor, pParams);

	const uint32_t N = pParams->m_num_selector_weights;

	color_quad_u8 weightedColors[16];
	weightedColors[0] = actualMinColor;
	weightedColors[N - 1] = actualMaxColor;

	const uint32_t nc = pParams->m_has_alpha ? 4 : 3;
	for (uint32_t i = 1; i < (N - 1); i++)
		for (uint32_t j = 0; j < nc; j++)
			weightedColors[i].m_c[j] = (uint8_t)((actualMinColor.m_c[j] * (64 - pParams->m_pSelector_weights[i]) + actualMaxColor.m_c[j] * pParams->m_pSelector_weights[i] + 32) >> 6);

	const int lr = actualMinColor.m_c[0];
	const int lg = actualMinColor.m_c[1];
	const int lb = actualMinColor.m_c[2];
	const int dr = actualMaxColor.m_c[0] - lr;
	const int dg = actualMaxColor.m_c[1] - lg;
	const int db = actualMaxColor.m_c[2] - lb;
	
	uint64_t total_err = 0;
	
	if (!pParams->m_perceptual)
	{
		if (pParams->m_has_alpha)
		{
			const int la = actualMinColor.m_c[3];
			const int da = actualMaxColor.m_c[3] - la;

			const float f = N / (float)(squarei(dr) + squarei(dg) + squarei(db) + squarei(da) + .00000125f);

			for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
			{
				const color_quad_u8 *pC = &pParams->m_pPixels[i];
				int r = pC->m_c[0];
				int g = pC->m_c[1];
				int b = pC->m_c[2];
				int a = pC->m_c[3];

				int best_sel = (int)((float)((r - lr) * dr + (g - lg) * dg + (b - lb) * db + (a - la) * da) * f + .5f);
				best_sel = clampi(best_sel, 1, N - 1);

				uint64_t err0 = compute_color_distance_rgba(&weightedColors[best_sel - 1], pC, BC7ENC_FALSE, pParams->m_weights);
				uint64_t err1 = compute_color_distance_rgba(&weightedColors[best_sel], pC, BC7ENC_FALSE, pParams->m_weights);

				if (err1 > err0)
				{
					err1 = err0;
					--best_sel;
				}
				total_err += err1;

				pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
			}
		}
		else
		{
			const float f = N / (float)(squarei(dr) + squarei(dg) + squarei(db) + .00000125f);

			for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
			{
				const color_quad_u8 *pC = &pParams->m_pPixels[i];
				int r = pC->m_c[0];
				int g = pC->m_c[1];
				int b = pC->m_c[2];

				int sel = (int)((float)((r - lr) * dr + (g - lg) * dg + (b - lb) * db) * f + .5f);
				sel = clampi(sel, 1, N - 1);

				uint64_t err0 = compute_color_distance_rgb(&weightedColors[sel - 1], pC, BC7ENC_FALSE, pParams->m_weights);
				uint64_t err1 = compute_color_distance_rgb(&weightedColors[sel], pC, BC7ENC_FALSE, pParams->m_weights);

				int best_sel = sel;
				uint64_t best_err = err1;
				if (err0 < best_err)
				{
					best_err = err0;
					best_sel = sel - 1;
				}

				total_err += best_err;

				pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
			}
		}
	}
	else
	{
		// TODO: This could be improved.
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint64_t best_err = UINT64_MAX;
			uint32_t best_sel = 0;

			if (pParams->m_has_alpha)
			{
				for (uint32_t j = 0; j < N; j++)
				{
					uint64_t err = compute_color_distance_rgba(&weightedColors[j], &pParams->m_pPixels[i], BC7ENC_TRUE, pParams->m_weights);
					if (err < best_err)
					{
						best_err = err;
						best_sel = j;
					}
				}
			}
			else
			{
				for (uint32_t j = 0; j < N; j++)
				{
					uint64_t err = compute_color_distance_rgb(&weightedColors[j], &pParams->m_pPixels[i], BC7ENC_TRUE, pParams->m_weights);
					if (err < best_err)
					{
						best_err = err;
						best_sel = j;
					}
				}
			}

			total_err += best_err;

			pResults->m_pSelectors_temp[i] = (uint8_t)best_sel;
		}
	}

	if (total_err < pResults->m_best_overall_err)
	{
		pResults->m_best_overall_err = total_err;

		pResults->m_low_endpoint = *pLow;
		pResults->m_high_endpoint = *pHigh;

		pResults->m_pbits[0] = pbits[0];
		pResults->m_pbits[1] = pbits[1];

		memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
	}
				
	return total_err;
}